

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.c
# Opt level: O0

void translate(quadtype nextquad)

{
  quadtype nextquad_00;
  quadtype nextquad_01;
  quadtype nextquad_02;
  quadtype nextquad_03;
  quadtype nextquad_04;
  quadtype nextquad_05;
  quadtype nextquad_06;
  quadtype nextquad_07;
  quadtype nextquad_08;
  quadtype nextquad_09;
  quadtype qVar1;
  quadtype nextquad_10;
  quadtype nextquad_11;
  undefined4 in_stack_00000008;
  undefined4 in_stack_ffffffffffffffe4;
  int iVar2;
  
  qVar1 = nextquad;
  iVar2 = (int)&stack0x00000008;
  nextquad = qVar1;
  switch(in_stack_00000008) {
  case 1:
    nextquad_00.op3.opndtype = in_stack_ffffffffffffffe4;
    nextquad_00.opcode = nextquad.opcode;
    nextquad_00.op1 = nextquad.op1;
    nextquad_00.op2 = nextquad.op2;
    nextquad_00.op3.opnd = iVar2;
    transadd(nextquad_00);
    break;
  case 2:
    nextquad_01.op3.opndtype = in_stack_ffffffffffffffe4;
    nextquad_01.opcode = nextquad.opcode;
    nextquad_01.op1 = nextquad.op1;
    nextquad_01.op2 = nextquad.op2;
    nextquad_01.op3.opnd = iVar2;
    transsub(nextquad_01);
    break;
  case 3:
    nextquad_02.op3.opndtype = in_stack_ffffffffffffffe4;
    nextquad_02.opcode = nextquad.opcode;
    nextquad_02.op1 = nextquad.op1;
    nextquad_02.op2 = nextquad.op2;
    nextquad_02.op3.opnd = iVar2;
    transneg(nextquad_02);
    break;
  case 4:
    nextquad_03.op3.opndtype = in_stack_ffffffffffffffe4;
    nextquad_03.opcode = nextquad.opcode;
    nextquad_03.op1 = nextquad.op1;
    nextquad_03.op2 = nextquad.op2;
    nextquad_03.op3.opnd = iVar2;
    transmult(nextquad_03);
    break;
  case 5:
    nextquad_04.op3.opndtype = in_stack_ffffffffffffffe4;
    nextquad_04.opcode = nextquad.opcode;
    nextquad_04.op1 = nextquad.op1;
    nextquad_04.op2 = nextquad.op2;
    nextquad_04.op3.opnd = iVar2;
    transdiv(nextquad_04);
    break;
  case 6:
    nextquad_05.op3.opndtype = in_stack_ffffffffffffffe4;
    nextquad_05.opcode = nextquad.opcode;
    nextquad_05.op1 = nextquad.op1;
    nextquad_05.op2 = nextquad.op2;
    nextquad_05.op3.opnd = iVar2;
    transassn(nextquad_05);
    break;
  case 7:
    nextquad_10.op3.opndtype = in_stack_ffffffffffffffe4;
    nextquad_10.opcode = nextquad.opcode;
    nextquad_10.op1 = nextquad.op1;
    nextquad_10.op2 = nextquad.op2;
    nextquad_10.op3.opnd = iVar2;
    transarg(nextquad_10);
    break;
  case 8:
    nextquad_06.op3.opndtype = in_stack_ffffffffffffffe4;
    nextquad_06.opcode = nextquad.opcode;
    nextquad_06.op1 = nextquad.op1;
    nextquad_06.op2 = nextquad.op2;
    nextquad_06.op3.opnd = iVar2;
    transjump(nextquad_06);
    break;
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
    nextquad_07.op3.opndtype = in_stack_ffffffffffffffe4;
    nextquad_07.opcode = nextquad.opcode;
    nextquad_07.op1 = nextquad.op1;
    nextquad_07.op2 = nextquad.op2;
    nextquad_07.op3.opnd = iVar2;
    transifjump(nextquad_07);
    break;
  case 0xf:
    nextquad_08.op3.opndtype = in_stack_ffffffffffffffe4;
    nextquad_08.opcode = nextquad.opcode;
    nextquad_08.op1 = nextquad.op1;
    nextquad_08.op2 = nextquad.op2;
    nextquad_08.op3.opnd = iVar2;
    translabel(nextquad_08);
    break;
  default:
    break;
  case 0x11:
    nextquad_11.op3.opndtype = in_stack_ffffffffffffffe4;
    nextquad_11.opcode = nextquad.opcode;
    nextquad_11.op1 = nextquad.op1;
    nextquad_11.op2 = nextquad.op2;
    nextquad_11.op3.opnd = iVar2;
    transproc(nextquad_11);
    break;
  case 0x12:
    nextquad_09.op3.opndtype = in_stack_ffffffffffffffe4;
    nextquad_09.opcode = nextquad.opcode;
    nextquad_09.op1 = nextquad.op1;
    nextquad_09.op2 = nextquad.op2;
    nextquad_09.op3.opnd = iVar2;
    transread(nextquad_09);
    break;
  case 0x13:
    qVar1.op3.opndtype = in_stack_ffffffffffffffe4;
    qVar1.opcode = nextquad.opcode;
    qVar1.op1 = nextquad.op1;
    qVar1.op2 = nextquad.op2;
    qVar1.op3.opnd = iVar2;
    transwrite(qVar1);
  }
  return;
}

Assistant:

void    translate(struct quadtype nextquad)
{
    switch(nextquad.opcode)    {
        case opadd:        transadd(nextquad);  break;
        case opsub:        transsub(nextquad);  break;
        case opneg:        transneg(nextquad);  break;
        case opmult:        transmult(nextquad); break;
        case opdiv:        transdiv(nextquad); break;
        case opassn:      transassn(nextquad);  break;
        case opjump:        transjump(nextquad); break;
        case opifposzjump:
        case opifposjump:
        case opifnegzjump:
        case opifnegjump:
        case opifzjump:
        case opifnzjump:    transifjump(nextquad); break;
            
        case oplabel:        translabel(nextquad); break;
        case opread:        transread(nextquad); break;
        case opwrite:        transwrite(nextquad); break;
        case oparg:        transarg(nextquad); break;
        case opproc:        transproc(nextquad); break;
        default: break;
    }
}